

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_ieee754_fltan(asmcode *code,compiler_options *param_2)

{
  operand oVar1;
  operand local_48;
  operand local_44;
  operand local_40;
  operand local_3c;
  uint64_t header;
  
  local_48 = AH;
  local_44 = RAX;
  oVar1 = NUMBER;
  header = 0xfffffffffffffff8;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_48,&local_44,&local_40,&header);
  header = CONCAT44(header._4_4_,0x16);
  local_48 = MEM_RAX;
  local_44 = DH;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,(operation *)&header,&local_48,(int *)&local_44);
  header = 0x100000000000001;
  local_48 = ST6;
  local_40 = RBP;
  local_44 = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_44,&local_40);
  local_48 = XMM6;
  local_3c = CL;
  local_44 = RBX;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,&local_44,&local_40,(int *)&local_3c);
  local_48 = ST6;
  local_44 = RAX;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_48,&local_44,&local_40,&header);
  local_48 = ST6;
  local_44 = MEM_RBP;
  local_40 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_44,&local_40);
  local_48 = MEM_RSI;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_48);
  local_44 = ST0;
  local_48 = MEM_R9;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_48,&local_44);
  local_40 = DH;
  local_48 = MEM_R9;
  local_44 = MEM_RBP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,&local_48,&local_44,(int *)&local_40);
  local_48 = EMPTY;
  local_44 = RBP;
  local_40 = NUMBER;
  local_3c = local_44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,&local_44,&local_40,(int *)&local_3c);
  local_48 = ST6;
  local_44 = RAX;
  local_40 = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_44,&local_40);
  return;
}

Assistant:

void inline_ieee754_fltan(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::FLD, ASM::asmcode::MEM_RAX, CELLS(1));

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FPTAN);
  code.add(ASM::asmcode::FSTP, ASM::asmcode::ST0);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }